

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase916::run(TestCase916 *this)

{
  WaitScope *waitScope;
  long *plVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  PromiseNode *pPVar4;
  PipelineHook *pPVar5;
  PipelineOp *pPVar6;
  size_t sVar7;
  CapTableBuilder *pCVar8;
  WirePointer *pWVar9;
  undefined8 uVar10;
  RequestHook *pRVar11;
  Event *pEVar12;
  Disposer *pDVar13;
  TaskSet *pTVar14;
  EventLoop *pEVar15;
  socklen_t in_ECX;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *__n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  int in_R8D;
  Own<capnp::ClientHook> OVar16;
  Client pipeline;
  Client client;
  Client cap;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client> paf;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call3;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> echo;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> earlyCall;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call5;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call4;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call2;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  echoRequest;
  NullableValue<kj::Exception> exception;
  TestContext context;
  undefined1 auStack_728 [16];
  long *local_718;
  undefined1 local_710 [16];
  PromiseNode *pPStack_700;
  pointer_____offset_0x10___ *local_6f8;
  long *local_6f0;
  long *local_6e8;
  undefined8 *local_6e0;
  long *local_6d8;
  undefined8 *local_6d0;
  long *local_6c8;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_6c0;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  local_688;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_650;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_618;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_5e0;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_5a8;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_570;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_538;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  local_500;
  undefined1 local_4c8 [12];
  undefined4 uStack_4bc;
  Event *local_4b8;
  Event *pEStack_4b0;
  undefined8 local_4a8;
  Disposer *pDStack_4a0;
  TaskSet *local_498;
  EventLoop *pEStack_490;
  ArrayDisposer *local_488;
  Disposer *pDStack_480;
  Context *local_478;
  undefined1 local_470 [264];
  Maybe<kj::Exception> local_368;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_208 [3];
  undefined8 *local_1d8;
  long *local_1d0;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_1c8 [3];
  undefined8 *local_198;
  long *local_190;
  Runnable local_188 [2];
  Maybe<capnp::MessageSize> local_178;
  Maybe<capnp::MessageSize> local_160;
  TestContext local_148;
  
  TestContext::TestContext(&local_148);
  TestContext::connect((TestContext *)&local_368,(int)&local_148,(sockaddr *)0x5,in_ECX);
  (**(code **)(*(long *)local_368.ptr.field_1.value.ownFile.content.ptr + 0x20))(local_4c8);
  uVar10 = local_368.ptr.field_1.value.ownFile.content.ptr;
  local_710._8_4_ = local_4c8._0_4_;
  local_710._12_4_ = local_4c8._4_4_;
  pPStack_700 = stack0xfffffffffffffb40;
  local_710._0_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if ((long *)local_368.ptr.field_1.value.ownFile.content.ptr != (long *)0x0) {
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_368.ptr._0_8_)
              (local_368.ptr._0_8_,(char *)(uVar10 + *(long *)(*(long *)uVar10 + -0x10)));
  }
  kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>();
  __n = &local_500;
  kj::
  heap<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,capnproto_test::capnp::test::TestCallOrder::Client,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestCallOrder::Client,void>(kj::Promise<capnproto_test::capnp::test::TestCallOrder::Client>&&)::_lambda(capnproto_test::capnp::test::TestCallOrder::Client&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestCallOrder::Client,void>(kj::Promise<capnproto_test::capnp::test::TestCallOrder::Client>&&)::_lambda(capnproto_test::capnp::test::TestCallOrder::Client&&)_1_,kj::_::PropagateException>
            ((Own<kj::_::PromiseNode> *)local_4c8,(anon_class_1_0_00000001_for_func *)&local_6e0,
             (PropagateException *)&local_650);
  local_368.ptr._0_8_ = CONCAT44(local_4c8._4_4_,local_4c8._0_4_);
  local_368.ptr.field_1.value.ownFile.content.ptr = (char *)stack0xfffffffffffffb40;
  OVar16 = newLocalPromiseClient
                     ((capnp *)&local_6f0,(Promise<kj::Own<capnp::ClientHook>_> *)&local_368);
  uVar10 = local_368.ptr.field_1.value.ownFile.content.ptr;
  if ((PromiseNode *)local_368.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0) {
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_368.ptr._0_8_)
              (local_368.ptr._0_8_,(char *)(uVar10 + (long)(*(_func_int ***)uVar10)[-2]),OVar16.ptr)
    ;
  }
  local_6f8 = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_160.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_4c8,
             (Client *)(local_710 + (long)*(pointer_____offset_0x10___ *)(local_710._0_8_ + -0x20)),
             &local_160);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_650,(int)local_4c8,__buf,(size_t)__n,in_R8D);
  pTVar14 = local_498;
  if (local_498 != (TaskSet *)0x0) {
    local_498 = (TaskSet *)0x0;
    (**pDStack_4a0->_vptr_Disposer)
              (pDStack_4a0,
               (long)&pTVar14->errorHandler + (long)pTVar14->errorHandler[-2]._vptr_ErrorHandler);
  }
  local_178.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
            (&local_500,(Client *)local_710,&local_178);
  local_4c8._0_4_ = local_500.super_Builder._builder.segment._0_4_;
  local_4c8._4_4_ = local_500.super_Builder._builder.segment._4_4_;
  stack0xfffffffffffffb40 =
       (PromiseNode *)
       CONCAT44(local_500.super_Builder._builder.capTable._4_4_,
                local_500.super_Builder._builder.capTable._0_4_);
  local_4b8 = (Event *)local_500.super_Builder._builder.pointers;
  (**(code **)(**(long **)((long)&local_6f0 + (long)local_6f8[-3]) + 0x20))(&local_368);
  PointerBuilder::setCapability((PointerBuilder *)local_4c8,(Own<capnp::ClientHook> *)&local_368);
  uVar10 = local_368.ptr.field_1.value.ownFile.content.ptr;
  __buf_00 = extraout_RDX;
  if ((PromiseNode *)local_368.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0) {
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_368.ptr._0_8_)
              (local_368.ptr._0_8_,(char *)(uVar10 + (long)(*(_func_int ***)uVar10)[-2]));
    __buf_00 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::send(&local_688,(int)&local_500,__buf_00,(size_t)__n,in_R8D);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Pipeline::getCap
            ((Client *)auStack_728,(Pipeline *)&local_688.super_Builder._builder.data);
  getCallSequence(&local_538,(Client *)auStack_728,0);
  getCallSequence(&local_570,(Client *)auStack_728,1);
  waitScope = &local_148.waitScope;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_1c8,&local_650);
  plVar1 = local_190;
  if (local_190 != (long *)0x0) {
    local_190 = (long *)0x0;
    (**(code **)*local_198)(local_198,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  getCallSequence(&local_5a8,(Client *)auStack_728,2);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *)
             local_4c8,&local_688);
  if (local_4a8._4_2_ == 0) {
    local_368.ptr.field_1._16_4_ = 0x7fffffff;
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)(PromiseNode *)0x0;
    local_368.ptr.field_1.value.ownFile.content.size_ = (size_t)(Event *)0x0;
    local_368.ptr._0_8_ = (Disposer *)0x0;
  }
  else {
    local_368.ptr._0_8_ = CONCAT44(local_4c8._4_4_,local_4c8._0_4_);
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)stack0xfffffffffffffb40;
    local_368.ptr.field_1.value.ownFile.content.size_ = (size_t)pEStack_4b0;
    local_368.ptr.field_1._16_4_ = pDStack_4a0._0_4_;
  }
  OVar16 = PointerReader::getCapability((PointerReader *)&local_6c0);
  pEVar15 = pEStack_490;
  pPVar2 = local_6c0.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  pDVar3 = local_6c0.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.disposer;
  if (pEStack_490 != (EventLoop *)0x0) {
    pEStack_490 = (EventLoop *)0x0;
    (*(code *)local_498->errorHandler->_vptr_ErrorHandler)
              (local_498,(long)&pEVar15->port + (long)pEVar15->port[-2]._vptr_EventPort,OVar16.ptr);
  }
  getCallSequence(&local_6c0,(Client *)auStack_728,3);
  getCallSequence(&local_5e0,(Client *)auStack_728,4);
  getCallSequence(&local_618,(Client *)auStack_728,5);
  plVar1 = local_6c8;
  local_188[0]._vptr_Runnable = (_func_int **)&PTR_run_00631e00;
  kj::_::runCatchingExceptions(&local_368,local_188);
  local_4c8[0] = local_368.ptr.isSet;
  if (local_368.ptr.isSet == true) {
    stack0xfffffffffffffb40 = (PromiseNode *)local_368.ptr.field_1.value.ownFile.content.ptr;
    pEStack_4b0 = (Event *)CONCAT44(local_368.ptr.field_1._20_4_,local_368.ptr.field_1._16_4_);
    local_4b8 = (Event *)local_368.ptr.field_1.value.ownFile.content.size_;
    local_368.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_368.ptr.field_1.value.ownFile.content.size_ = 0;
    local_4a8 = (PipelineOp *)local_368.ptr.field_1.value.file;
    pDStack_4a0 = (Disposer *)local_368.ptr.field_1._32_8_;
    local_498 = (TaskSet *)local_368.ptr.field_1.value.description.content.ptr;
    pEStack_490 = (EventLoop *)local_368.ptr.field_1.value.description.content.size_;
    local_488 = local_368.ptr.field_1.value.description.content.disposer;
    pDStack_480 = local_368.ptr.field_1.value.context.ptr.disposer;
    local_368.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_368.ptr.field_1.value.description.content.size_ = 0;
    local_478 = local_368.ptr.field_1.value.context.ptr.ptr;
    local_368.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_470,(void *)((long)&local_368.ptr.field_1 + 0x50),0x104);
    kj::Exception::~Exception(&local_368.ptr.field_1.value);
  }
  if (local_4c8[0] == '\x01') {
    (**(code **)(*plVar1 + 8))(plVar1,(Exception *)(local_4c8 + 8));
  }
  if (local_4c8[0] == '\x01') {
    kj::Exception::~Exception((Exception *)(local_4c8 + 8));
  }
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_538.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_570.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_5a8.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_6c0.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_5e0.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&local_618.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)local_4c8,
                  (Client *)
                  (&((Client *)local_710)->field_0x0 +
                  (long)*(pointer_____offset_0x10___ *)(local_710._0_8_ + -0x20)),1);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_208,local_4c8);
  plVar1 = local_1d0;
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(code **)*local_1d8)(local_1d8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  pDVar13 = pDStack_4a0;
  pPVar6 = local_4a8;
  if (local_4a8 != (PipelineOp *)0x0) {
    local_4a8 = (PipelineOp *)0x0;
    pDStack_4a0 = (Disposer *)0x0;
    (*(code *)local_498->errorHandler->_vptr_ErrorHandler)(local_498,pPVar6,8,pDVar13,pDVar13,0);
  }
  pEVar12 = pEStack_4b0;
  if (pEStack_4b0 != (Event *)0x0) {
    pEStack_4b0 = (Event *)0x0;
    (**local_4b8->_vptr_Event)
              (local_4b8,(_func_int *)((long)&pEVar12->_vptr_Event + (long)pEVar12->_vptr_Event[-2])
              );
  }
  pPVar4 = stack0xfffffffffffffb40;
  if (stack0xfffffffffffffb40 != (PromiseNode *)0x0) {
    stack0xfffffffffffffb40 = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_4c8._4_4_,local_4c8._0_4_))
              ((undefined8 *)CONCAT44(local_4c8._4_4_,local_4c8._0_4_),
               (_func_int *)((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2])
              );
  }
  sVar7 = local_618.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_618.super_Pipeline._typeless.ops.ptr;
  if (local_618.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_618.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_618.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_618.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_618.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_618.super_Pipeline._typeless.hook.ptr;
  if (local_618.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_618.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_618.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_618.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar4 = local_618.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_618.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_618.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_618.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_618.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2])
              );
  }
  sVar7 = local_5e0.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_5e0.super_Pipeline._typeless.ops.ptr;
  if (local_5e0.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_5e0.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_5e0.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_5e0.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_5e0.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_5e0.super_Pipeline._typeless.hook.ptr;
  if (local_5e0.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_5e0.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_5e0.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_5e0.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar4 = local_5e0.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_5e0.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_5e0.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_5e0.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_5e0.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2])
              );
  }
  sVar7 = local_6c0.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_6c0.super_Pipeline._typeless.ops.ptr;
  if (local_6c0.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_6c0.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_6c0.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_6c0.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_6c0.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_6c0.super_Pipeline._typeless.hook.ptr;
  if (local_6c0.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_6c0.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_6c0.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_6c0.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar4 = local_6c0.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_6c0.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_6c0.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_6c0.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_6c0.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2])
              );
  }
  if (pPVar2 != (PromiseNode *)0x0) {
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(_func_int *)
                      ((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2]));
  }
  sVar7 = local_5a8.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_5a8.super_Pipeline._typeless.ops.ptr;
  if (local_5a8.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_5a8.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_5a8.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_5a8.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_5a8.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_5a8.super_Pipeline._typeless.hook.ptr;
  if (local_5a8.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_5a8.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_5a8.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_5a8.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar2 = local_5a8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_5a8.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_5a8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_5a8.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_5a8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
  }
  sVar7 = local_570.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_570.super_Pipeline._typeless.ops.ptr;
  if (local_570.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_570.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_570.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_570.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_570.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_570.super_Pipeline._typeless.hook.ptr;
  if (local_570.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_570.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_570.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_570.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar2 = local_570.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_570.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_570.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_570.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_570.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
  }
  sVar7 = local_538.super_Pipeline._typeless.ops.size_;
  pPVar6 = local_538.super_Pipeline._typeless.ops.ptr;
  if (local_538.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_538.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_538.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_538.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_538.super_Pipeline._typeless.ops.disposer,pPVar6,8,sVar7,sVar7,0);
  }
  pPVar5 = local_538.super_Pipeline._typeless.hook.ptr;
  if (local_538.super_Pipeline._typeless.hook.ptr != (PipelineHook *)0x0) {
    local_538.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_538.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_538.super_Pipeline._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar5->_vptr_PipelineHook + (long)pPVar5->_vptr_PipelineHook[-2]));
  }
  pPVar2 = local_538.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
           .super_PromiseBase.node.ptr;
  if (local_538.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_538.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_538.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
        .super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_538.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
  }
  plVar1 = local_718;
  if (local_718 != (long *)0x0) {
    local_718 = (long *)0x0;
    (*(code *)**(undefined8 **)auStack_728._8_8_)
              (auStack_728._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  pDVar3 = local_688.hook.disposer;
  uVar10 = local_688.super_Builder._builder._32_8_;
  if (local_688.super_Builder._builder._32_8_ != 0) {
    local_688.super_Builder._builder.dataSize = 0;
    local_688.super_Builder._builder.pointerCount = 0;
    local_688.super_Builder._builder._38_2_ = 0;
    local_688.hook.disposer = (Disposer *)0x0;
    (**(local_688.hook.ptr)->_vptr_RequestHook)(local_688.hook.ptr,uVar10,8,pDVar3,pDVar3,0);
  }
  pWVar9 = local_688.super_Builder._builder.pointers;
  if (local_688.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_688.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_688.super_Builder._builder.data)
              (local_688.super_Builder._builder.data,
               (long)&(pWVar9->offsetAndKind).value + *(long *)((long)*pWVar9 + -0x10));
  }
  pCVar8 = local_688.super_Builder._builder.capTable;
  if (local_688.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_688.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_688.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_688.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar8->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar8->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar11 = local_500.hook.ptr;
  if (local_500.hook.ptr != (RequestHook *)0x0) {
    local_500.hook.ptr = (RequestHook *)0x0;
    (**(local_500.hook.disposer)->_vptr_Disposer)
              (local_500.hook.disposer,
               (_func_int *)
               ((long)&pRVar11->_vptr_RequestHook + (long)pRVar11->_vptr_RequestHook[-2]));
  }
  pDVar3 = local_650.hook.disposer;
  uVar10 = local_650.super_Builder._builder._32_8_;
  if (local_650.super_Builder._builder._32_8_ != 0) {
    local_650.super_Builder._builder.dataSize = 0;
    local_650.super_Builder._builder.pointerCount = 0;
    local_650.super_Builder._builder._38_2_ = 0;
    local_650.hook.disposer = (Disposer *)0x0;
    (**(local_650.hook.ptr)->_vptr_RequestHook)(local_650.hook.ptr,uVar10,8,pDVar3,pDVar3,0);
  }
  pWVar9 = local_650.super_Builder._builder.pointers;
  if (local_650.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_650.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_650.super_Builder._builder.data)
              (local_650.super_Builder._builder.data,
               (long)&(pWVar9->offsetAndKind).value + *(long *)((long)*pWVar9 + -0x10));
  }
  pCVar8 = local_650.super_Builder._builder.capTable;
  if (local_650.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_650.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_650.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_650.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar8->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar8->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  plVar1 = local_6e8;
  if (local_6e8 != (long *)0x0) {
    local_6e8 = (long *)0x0;
    (**(code **)*local_6f0)(local_6f0,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_6c8;
  if (local_6c8 != (long *)0x0) {
    local_6c8 = (long *)0x0;
    (**(code **)*local_6d0)(local_6d0,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_6d8;
  if (local_6d8 != (long *)0x0) {
    local_6d8 = (long *)0x0;
    (**(code **)*local_6e0)(local_6e0,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  pPVar2 = pPStack_700;
  if (pPStack_700 != (PromiseNode *)0x0) {
    pPStack_700 = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_710._12_4_,local_710._8_4_))
              ((undefined8 *)CONCAT44(local_710._12_4_,local_710._8_4_),
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
  }
  TestContext::~TestContext(&local_148);
  return;
}

Assistant:

TEST(Rpc, EmbargoError) {
  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto paf = kj::newPromiseAndFulfiller<test::TestCallOrder::Client>();

  auto cap = test::TestCallOrder::Client(kj::mv(paf.promise));

  auto earlyCall = client.getCallSequenceRequest().send();

  auto echoRequest = client.echoRequest();
  echoRequest.setCap(cap);
  auto echo = echoRequest.send();

  auto pipeline = echo.getCap();

  auto call0 = getCallSequence(pipeline, 0);
  auto call1 = getCallSequence(pipeline, 1);

  earlyCall.wait(context.waitScope);

  auto call2 = getCallSequence(pipeline, 2);

  auto resolved = echo.wait(context.waitScope).getCap();

  auto call3 = getCallSequence(pipeline, 3);
  auto call4 = getCallSequence(pipeline, 4);
  auto call5 = getCallSequence(pipeline, 5);

  paf.fulfiller->rejectIfThrows([]() { KJ_FAIL_ASSERT("foo") { break; } });

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);
  expectPromiseThrows(kj::mv(call2), context.waitScope);
  expectPromiseThrows(kj::mv(call3), context.waitScope);
  expectPromiseThrows(kj::mv(call4), context.waitScope);
  expectPromiseThrows(kj::mv(call5), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 1).wait(context.waitScope);
}